

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O1

void Fxch_ManComputeLevel(Fxch_Man_t *pFxchMan)

{
  uint *puVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Wec_t *pVVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  
  if (pFxchMan->vCubes->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar3 = pFxchMan->vCubes->pArray;
  if (0 < pVVar3->nSize) {
    uVar6 = *pVVar3->pArray;
    iVar7 = pFxchMan->nVars;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    iVar9 = 0x10;
    if (0xe < iVar7 - 1U) {
      iVar9 = iVar7;
    }
    pVVar3->nSize = 0;
    pVVar3->nCap = iVar9;
    if (iVar9 == 0) {
      piVar4 = (int *)0x0;
    }
    else {
      piVar4 = (int *)malloc((long)iVar9 << 2);
    }
    pVVar3->pArray = piVar4;
    pVVar3->nSize = iVar7;
    iVar9 = 0;
    memset(piVar4,0,(long)iVar7 << 2);
    pFxchMan->vLevels = pVVar3;
    pVVar5 = pFxchMan->vCubes;
    if (0 < pVVar5->nSize) {
      lVar8 = 0;
      lVar10 = 0;
      do {
        pVVar3 = pVVar5->pArray;
        if (*(int *)((long)&pVVar3->nSize + lVar8) < 1) goto LAB_0045abc4;
        puVar1 = *(uint **)((long)&pVVar3->pArray + lVar8);
        if (uVar6 != *puVar1) {
          if (((int)uVar6 < 0) || (pFxchMan->vLevels->nSize <= (int)uVar6)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          piVar4 = pFxchMan->vLevels->pArray;
          iVar7 = piVar4[uVar6] - iVar9;
          iVar9 = (int)lVar10;
          piVar4[uVar6] = iVar7 + iVar9;
          if (*(int *)((long)&pVVar3->nSize + lVar8) < 1) goto LAB_0045abc4;
          uVar6 = *puVar1;
        }
        pVVar2 = pFxchMan->vLevels;
        iVar7 = Fxch_ManComputeLevelCube(pFxchMan,(Vec_Int_t *)((long)&pVVar3->nCap + lVar8));
        if (((int)uVar6 < 0) || (pVVar2->nSize <= (int)uVar6)) goto LAB_0045abc4;
        piVar4 = pVVar2->pArray;
        if (piVar4[uVar6] < iVar7) {
          piVar4[uVar6] = iVar7;
        }
        lVar10 = lVar10 + 1;
        pVVar5 = pFxchMan->vCubes;
        lVar8 = lVar8 + 0x10;
      } while (lVar10 < pVVar5->nSize);
    }
    return;
  }
LAB_0045abc4:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Fxch_ManComputeLevel( Fxch_Man_t* pFxchMan )
{
    Vec_Int_t* vCube;
    int i,
        iVar,
        iFirst = 0;

    iVar = Vec_IntEntry( Vec_WecEntry( pFxchMan->vCubes, 0 ), 0 );
    pFxchMan->vLevels = Vec_IntStart( pFxchMan->nVars );

    Vec_WecForEachLevel( pFxchMan->vCubes, vCube, i )
    {
        if ( iVar != Vec_IntEntry( vCube, 0 ) )
        {
            Vec_IntAddToEntry( pFxchMan->vLevels, iVar, i - iFirst );
            iVar = Vec_IntEntry( vCube, 0 );
            iFirst = i;
        }
        Vec_IntUpdateEntry( pFxchMan->vLevels, iVar, Fxch_ManComputeLevelCube( pFxchMan, vCube ) );
    }
}